

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O2

int get_q(AV1_COMP *cpi)

{
  double dVar1;
  
  dVar1 = av1_convert_qindex_to_q
                    ((cpi->ppi->p_rc).avg_frame_qindex
                     [(cpi->ppi->gf_group).frame_type[cpi->gf_frame_index]],
                     ((cpi->common).seq_params)->bit_depth);
  return (int)dVar1;
}

Assistant:

static int get_q(const AV1_COMP *cpi) {
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  const FRAME_TYPE frame_type = gf_group->frame_type[cpi->gf_frame_index];
  const int q =
      (int)av1_convert_qindex_to_q(cpi->ppi->p_rc.avg_frame_qindex[frame_type],
                                   cpi->common.seq_params->bit_depth);
  return q;
}